

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::PrintTo<char,std::char_traits<char>>
               (basic_string_view<char,_std::char_traits<char>_> *value,iu_ostream *os)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  allocator<char> local_31;
  char *local_30 [4];
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_30,value,&local_31);
  UniversalTersePrint(local_30[0],os);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

inline void PrintTo(const ::std::basic_string_view<CharT, Traits>& value, iu_ostream* os)
{
    const ::std::basic_string<CharT, Traits> str{ value };
    UniversalTersePrint(str.c_str(), os);
}